

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void ThrowUnlessContains<unsigned_long>
               (unsigned_long x,vector<unsigned_long,_std::allocator<unsigned_long>_> *v,char *msg)

{
  bool bVar1;
  runtime_error *this;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_40;
  unsigned_long *local_38;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_30;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_28;
  char *local_20;
  char *msg_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *v_local;
  unsigned_long x_local;
  
  local_20 = msg;
  msg_local = (char *)v;
  v_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)x;
  local_30._M_current =
       (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(v);
  local_38 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)msg_local);
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                       (local_30,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )local_38,(unsigned_long *)&v_local);
  local_40._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)msg_local);
  bVar1 = __gnu_cxx::operator==(&local_28,&local_40);
  if (!bVar1) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,local_20);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ThrowUnlessContains(T x, const std::vector<T>& v, const char* msg) {
  if (std::find(v.begin(), v.end(), x) == v.end()) {
    throw Error(msg);
  }
}